

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

TaskHandle __thiscall
Task::dealloc(Task *this,
             vector<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_> *operands)

{
  pointer psVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  pointer psVar4;
  TaskHandle TVar5;
  OperandUsage local_98;
  
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Task,std::allocator<Task>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->name,(Task **)this,
             (allocator<Task> *)&local_98);
  std::__cxx11::string::_M_replace(*(long *)this + 8,0,*(char **)(*(long *)this + 0x10),0x1375f6);
  psVar4 = (operands->
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (operands->
           super__Vector_base<std::shared_ptr<Operand>,_std::allocator<std::shared_ptr<Operand>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var3._M_pi = extraout_RDX;
  if (psVar4 != psVar1) {
    do {
      lVar2 = *(long *)this;
      local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar4->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar4->super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      local_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_98.version = 0;
      local_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
      ;
      local_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::vector<OperandUsage,_std::allocator<OperandUsage>_>::emplace_back<OperandUsage>
                ((vector<OperandUsage,_std::allocator<OperandUsage>_> *)(lVar2 + 0x48),&local_98);
      _Var3._M_pi = extraout_RDX_00;
      if (local_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.last_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_01;
      }
      if (local_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.next_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_02;
      }
      if (local_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.prev_use.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_03;
      }
      if (local_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.next_gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_04;
      }
      if (local_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.gen.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
        _Var3._M_pi = extraout_RDX_05;
      }
      if (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.operand.super___shared_ptr<Operand,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var3._M_pi = extraout_RDX_06;
      }
      psVar4 = psVar4 + 1;
    } while (psVar4 != psVar1);
  }
  TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TaskHandle)TVar5.super___shared_ptr<Task,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static TaskHandle dealloc(const std::vector<OperandHandle> &operands) {
        auto task = std::make_shared<Task>();
        task->name = ".dealloc";
        for (auto &operand: operands) {
            task->outs.push_back(OperandUsage{ operand });
        }
        return task;
    }